

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O1

void __thiscall OjaNewton::initialize_Z(OjaNewton *this,parameters *weights)

{
  sparse_parameters *this_00;
  bool bVar1;
  double dVar2;
  weight *pwVar3;
  uint32_t i_1;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t i;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float local_58;
  
  uVar4 = 1L << ((byte)this->all->num_bits & 0x3f);
  if (this->normalize == true) {
    uVar8 = 0;
    do {
      if (weights->sparse == true) {
        pwVar3 = sparse_parameters::operator[]
                           (&weights->sparse_weights,
                            uVar8 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
      }
      else {
        pwVar3 = (weights->dense_weights)._begin +
                 (uVar8 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                 (weights->dense_weights)._weight_mask);
      }
      pwVar3[(long)this->m + 1] = 0.1;
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  uVar4 = uVar4 & 0xffffffff;
  if (this->random_init == false) {
    if (0 < this->m) {
      lVar5 = 1;
      do {
        if (weights->sparse == true) {
          pwVar3 = sparse_parameters::operator[]
                             (&weights->sparse_weights,
                              lVar5 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
        }
        else {
          pwVar3 = (weights->dense_weights)._begin +
                   (lVar5 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                   (weights->dense_weights)._weight_mask);
        }
        pwVar3[lVar5] = 1.0;
        bVar1 = lVar5 < this->m;
        lVar5 = lVar5 + 1;
      } while (bVar1);
    }
  }
  else {
    uVar8 = 0;
    do {
      if (weights->sparse == true) {
        pwVar3 = sparse_parameters::operator[]
                           (&weights->sparse_weights,
                            uVar8 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
      }
      else {
        pwVar3 = (weights->dense_weights)._begin +
                 (uVar8 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                 (weights->dense_weights)._weight_mask);
      }
      if (0 < this->m) {
        lVar5 = 1;
        do {
          do {
            fVar9 = merand48(&this->all->random_state);
            fVar10 = merand48(&this->all->random_state);
          } while (fVar9 == 0.0);
          fVar9 = logf(fVar9);
          fVar9 = fVar9 * -2.0;
          if (fVar9 < 0.0) {
            fVar9 = sqrtf(fVar9);
          }
          else {
            fVar9 = SQRT(fVar9);
          }
          dVar2 = cos((double)fVar10 * 6.2831854820251465);
          pwVar3[lVar5] = (float)dVar2 * fVar9;
          bVar1 = lVar5 < this->m;
          lVar5 = lVar5 + 1;
        } while (bVar1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar4);
  }
  if (0 < this->m) {
    this_00 = &weights->sparse_weights;
    uVar8 = 1;
    do {
      if (1 < uVar8) {
        uVar7 = 1;
        do {
          local_58 = 0.0;
          uVar6 = 0;
          do {
            if (weights->sparse == true) {
              pwVar3 = sparse_parameters::operator[]
                                 (this_00,uVar6 << ((byte)(weights->sparse_weights)._stride_shift &
                                                   0x3f));
            }
            else {
              pwVar3 = (weights->dense_weights)._begin +
                       (uVar6 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                       (weights->dense_weights)._weight_mask);
            }
            fVar9 = pwVar3[uVar8];
            if (weights->sparse == true) {
              pwVar3 = sparse_parameters::operator[]
                                 (this_00,uVar6 << ((byte)(weights->sparse_weights)._stride_shift &
                                                   0x3f));
            }
            else {
              pwVar3 = (weights->dense_weights)._begin +
                       (uVar6 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                       (weights->dense_weights)._weight_mask);
            }
            local_58 = local_58 + fVar9 * pwVar3[uVar7];
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
          local_58 = -local_58;
          uVar6 = 0;
          do {
            if (weights->sparse == true) {
              pwVar3 = sparse_parameters::operator[]
                                 (this_00,uVar6 << ((byte)(weights->sparse_weights)._stride_shift &
                                                   0x3f));
            }
            else {
              pwVar3 = (weights->dense_weights)._begin +
                       (uVar6 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                       (weights->dense_weights)._weight_mask);
            }
            fVar9 = pwVar3[uVar7];
            if (weights->sparse == true) {
              pwVar3 = sparse_parameters::operator[]
                                 (this_00,uVar6 << ((byte)(weights->sparse_weights)._stride_shift &
                                                   0x3f));
            }
            else {
              pwVar3 = (weights->dense_weights)._begin +
                       (uVar6 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                       (weights->dense_weights)._weight_mask);
            }
            pwVar3[uVar8] = fVar9 * local_58 + pwVar3[uVar8];
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar8);
      }
      dVar2 = 0.0;
      uVar7 = 0;
      do {
        if (weights->sparse == true) {
          pwVar3 = sparse_parameters::operator[]
                             (this_00,uVar7 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f
                                               ));
        }
        else {
          pwVar3 = (weights->dense_weights)._begin +
                   (uVar7 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                   (weights->dense_weights)._weight_mask);
        }
        fVar9 = pwVar3[uVar8];
        if (weights->sparse == true) {
          pwVar3 = sparse_parameters::operator[]
                             (this_00,uVar7 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f
                                               ));
        }
        else {
          pwVar3 = (weights->dense_weights)._begin +
                   (uVar7 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                   (weights->dense_weights)._weight_mask);
        }
        dVar2 = dVar2 + (double)fVar9 * (double)pwVar3[uVar8];
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      uVar7 = 0;
      do {
        if (weights->sparse == true) {
          pwVar3 = sparse_parameters::operator[]
                             (this_00,uVar7 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f
                                               ));
        }
        else {
          pwVar3 = (weights->dense_weights)._begin +
                   (uVar7 << ((byte)(weights->dense_weights)._stride_shift & 0x3f) &
                   (weights->dense_weights)._weight_mask);
        }
        pwVar3[uVar8] = pwVar3[uVar8] / (float)dVar2;
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
      bVar1 = (long)uVar8 < (long)this->m;
      uVar8 = uVar8 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void initialize_Z(parameters& weights)
  {
    uint32_t length = 1 << all->num_bits;
    if (normalize)  // initialize normalization part
    {
      for (uint32_t i = 0; i < length; i++) (&(weights.strided_index(i)))[NORM2] = 0.1f;
    }
    if (!random_init)
    {
      // simple initialization
      for (int i = 1; i <= m; i++) (&(weights.strided_index(i)))[i] = 1.f;
    }
    else
    {
      // more complicated initialization: orthgonal basis of a random matrix

      const double PI2 = 2.f * 3.1415927f;

      for (uint32_t i = 0; i < length; i++)
      {
        weight& w = weights.strided_index(i);
        float r1, r2;
        for (int j = 1; j <= m; j++)
        {
          //box-muller tranform: https://en.wikipedia.org/wiki/Box%E2%80%93Muller_transform
          //redraw until r1 should be strictly positive
          do
          {
            r1 = merand48(all->random_state);
            r2 = merand48(all->random_state);
          } while (r1 == 0.f);

          (&w)[j] = sqrt(-2.f * log(r1)) * (float)cos(PI2 * r2);
        }
      }
    }

    // Gram-Schmidt
    for (int j = 1; j <= m; j++)
    {
      for (int k = 1; k <= j - 1; k++)
      {
        double tmp = 0;

        for (uint32_t i = 0; i < length; i++)
          tmp += ((double)(&(weights.strided_index(i)))[j]) * (&(weights.strided_index(i)))[k];
        for (uint32_t i = 0; i < length; i++)
          (&(weights.strided_index(i)))[j] -= (float)tmp * (&(weights.strided_index(i)))[k];
      }
      double norm = 0;
      for (uint32_t i = 0; i < length; i++)
        norm += ((double)(&(weights.strided_index(i)))[j]) * (&(weights.strided_index(i)))[j];
      norm = sqrt(norm);
      for (uint32_t i = 0; i < length; i++) (&(weights.strided_index(i)))[j] /= (float)norm;
    }
  }